

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

int fdsocket_inerrfd_cmp(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)bv + 8) <= *(int *)((long)av + 8)) {
    uVar1 = (uint)(*(int *)((long)bv + 8) < *(int *)((long)av + 8));
  }
  return uVar1;
}

Assistant:

static int fdsocket_inerrfd_cmp(void *av, void *bv)
{
    FdSocket *a = (FdSocket *)av;
    FdSocket *b = (FdSocket *)bv;
    if (a->inerrfd < b->inerrfd)
        return -1;
    if (a->inerrfd > b->inerrfd)
        return +1;
    return 0;
}